

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::WaterTypeVisitor::visit(WaterTypeVisitor *this,RigidBody *rb)

{
  string *propName;
  undefined8 *puVar1;
  iterator iVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 *puVar5;
  pointer ppAVar6;
  long lVar7;
  pointer *pppAVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  string *this_00;
  pointer ppAVar10;
  pointer *pppAVar11;
  shared_ptr<OpenMD::GenericData> data;
  string rbName;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  pointer *local_70;
  pointer local_68;
  undefined1 local_60 [16];
  key_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(&local_98);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_98);
  if (local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->waterTypeList)._M_t,&local_50);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->waterTypeList)._M_t._M_impl.super__Rb_tree_header)
  {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ppAVar10 = (pointer)0x0;
    pppAVar11 = (pointer *)0x0;
  }
  else {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector(&local_98,&rb->atoms_);
    ppAVar10 = local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pppAVar11 = (pointer *)
                local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                .super__Vector_impl_data._M_start;
    if (local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68 = local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ppAVar6 = local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      pppAVar8 = (pointer *)
                 local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        propName = (string *)*pppAVar8;
        local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ATOMDATA","");
        StuntDouble::getPropertyByName((StuntDouble *)local_60,propName);
        if (local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_98.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
          local_70 = pppAVar8;
          lVar3 = __dynamic_cast(local_60._0_8_,&GenericData::typeinfo,&AtomData::typeinfo,0);
          lVar7 = 0;
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((lVar3 != 0) &&
             (lVar7 = lVar3, p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_
             , (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
            }
          }
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          p_Var4 = p_Var9;
          pppAVar8 = local_70;
          if (lVar7 != 0) {
            puVar1 = *(undefined8 **)(lVar7 + 0x28);
            local_78 = p_Var9;
            if (puVar1 == *(undefined8 **)(lVar7 + 0x30)) {
              this_00 = (string *)0x0;
              p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              this_00 = (string *)*puVar1;
              p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                }
              }
            }
            while (p_Var9 = p_Var4, this_00 != (string *)0x0) {
              puVar5 = puVar1 + 2;
              std::__cxx11::string::find((char)this_00,0x5f);
              std::__cxx11::string::substr((ulong)&local_98,(ulong)this_00);
              std::__cxx11::string::operator=(this_00,(string *)&local_98);
              if (local_98.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&local_98.
                            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_98.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_98.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if (puVar5 == *(undefined8 **)(lVar7 + 0x30)) {
                this_00 = (string *)0x0;
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                this_00 = (string *)*puVar5;
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[3];
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  }
                }
              }
              puVar1 = puVar5;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
            }
            p_Var4 = local_78;
            ppAVar6 = local_68;
            pppAVar8 = local_70;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              p_Var4 = local_78;
              ppAVar6 = local_68;
              pppAVar8 = local_70;
            }
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
        }
        pppAVar8 = pppAVar8 + 1;
      } while ((pointer)pppAVar8 != ppAVar6);
    }
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (pppAVar11 != (pointer *)0x0) {
    operator_delete(pppAVar11,(long)ppAVar10 - (long)pppAVar11);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void WaterTypeVisitor::visit(RigidBody* rb) {
    std::string rbName;
    std::vector<Atom*> myAtoms;
    std::vector<Atom*>::iterator atomIter;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    std::shared_ptr<AtomData> atomData;

    rbName = rb->getType();

    if (waterTypeList.find(rbName) != waterTypeList.end()) {
      myAtoms = rb->getAtoms();

      for (atomIter = myAtoms.begin(); atomIter != myAtoms.end(); ++atomIter) {
        std::shared_ptr<GenericData> data =
            (*atomIter)->getPropertyByName("ATOMDATA");

        if (data != nullptr) {
          atomData = std::dynamic_pointer_cast<AtomData>(data);

          if (atomData == nullptr) continue;
        } else
          continue;

        for (std::shared_ptr<AtomInfo> atomInfo = atomData->beginAtomInfo(i);
             atomInfo; atomInfo                 = atomData->nextAtomInfo(i)) {
          atomInfo->atomTypeName = trimmedName(atomInfo->atomTypeName);
        }
      }
    }
  }